

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_ptr.hpp
# Opt level: O3

Value * __thiscall
duckdb::array_ptr_iterator<duckdb::Value>::operator*(array_ptr_iterator<duckdb::Value> *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->index < this->size) {
    return this->ptr + this->index;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"array_ptr iterator dereferenced while iterator is out of range",""
            );
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DATA_TYPE &operator*() const {
		if (DUCKDB_UNLIKELY(index >= size)) {
			throw InternalException("array_ptr iterator dereferenced while iterator is out of range");
		}
		return ptr[index];
	}